

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_save.c
# Opt level: O3

void save_progs(FILE *fp,AREA_DATA_conflict *pArea)

{
  uint uVar1;
  ulong uVar2;
  ROOM_INDEX_DATA *pRVar3;
  MOB_INDEX_DATA *pMVar4;
  OBJ_INDEX_DATA *pOVar5;
  long lVar6;
  
  fwrite("#IMPROGS\n",9,1,(FILE *)fp);
  uVar2 = pArea->progtypes[0];
  if ((uVar2 & 1) != 0) {
    fprintf((FILE *)fp,"A pulse_prog %s\n",pArea->aprogs->pulse_name);
    uVar2 = pArea->progtypes[0];
  }
  if ((uVar2 & 2) != 0) {
    fprintf((FILE *)fp,"A reset_prog %s\n",pArea->aprogs->reset_name);
    uVar2 = pArea->progtypes[0];
  }
  if ((uVar2 & 4) != 0) {
    fprintf((FILE *)fp,"A sun_prog %s\n",pArea->aprogs->sun_name);
    uVar2 = pArea->progtypes[0];
  }
  if ((uVar2 & 8) != 0) {
    fprintf((FILE *)fp,"A tick_prog %s\n",pArea->aprogs->tick_name);
    uVar2 = pArea->progtypes[0];
  }
  if ((uVar2 & 0x10) != 0) {
    fprintf((FILE *)fp,"A aggress_prog %s\n",pArea->aprogs->aggress_name);
    uVar2 = pArea->progtypes[0];
  }
  if ((uVar2 & 0x20) != 0) {
    fprintf((FILE *)fp,"A myell_prog %s\n",pArea->aprogs->myell_name);
  }
  lVar6 = 0;
  do {
    for (pRVar3 = room_index_hash[lVar6]; pRVar3 != (ROOM_INDEX_DATA *)0x0; pRVar3 = pRVar3->next) {
      if (pRVar3->area == pArea) {
        uVar2 = pRVar3->progtypes[0];
        if ((uVar2 & 1) != 0) {
          fprintf((FILE *)fp,"R %d pulse_prog %s\n",(ulong)(uint)(int)pRVar3->vnum,
                  pRVar3->rprogs->pulse_name);
          uVar2 = pRVar3->progtypes[0];
        }
        if ((uVar2 & 2) != 0) {
          fprintf((FILE *)fp,"R %d entry_prog %s\n",(ulong)(uint)(int)pRVar3->vnum,
                  pRVar3->rprogs->entry_name);
          uVar2 = pRVar3->progtypes[0];
        }
        if ((uVar2 & 4) != 0) {
          fprintf((FILE *)fp,"R %d move_prog %s\n",(ulong)(uint)(int)pRVar3->vnum,
                  pRVar3->rprogs->move_name);
          uVar2 = pRVar3->progtypes[0];
        }
        if ((uVar2 & 8) != 0) {
          fprintf((FILE *)fp,"R %d drop_prog %s\n",(ulong)(uint)(int)pRVar3->vnum,
                  pRVar3->rprogs->drop_name);
          uVar2 = pRVar3->progtypes[0];
        }
        if ((uVar2 & 0x10) != 0) {
          fprintf((FILE *)fp,"R %d speech_prog %s\n",(ulong)(uint)(int)pRVar3->vnum,
                  pRVar3->rprogs->speech_name);
          uVar2 = pRVar3->progtypes[0];
        }
        if ((uVar2 & 0x20) != 0) {
          fprintf((FILE *)fp,"R %d open_prog %s\n",(ulong)(uint)(int)pRVar3->vnum,
                  pRVar3->rprogs->open_name);
        }
      }
    }
    for (pMVar4 = mob_index_hash[lVar6]; pMVar4 != (MOB_INDEX_DATA *)0x0; pMVar4 = pMVar4->next) {
      if (pMVar4->area == pArea) {
        uVar2 = pMVar4->progtypes[0];
        if ((uVar2 & 1) != 0) {
          fprintf((FILE *)fp,"M %d bribe_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->bribe_name);
          uVar2 = pMVar4->progtypes[0];
        }
        if ((uVar2 & 2) != 0) {
          fprintf((FILE *)fp,"M %d entry_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->entry_name);
          uVar2 = pMVar4->progtypes[0];
        }
        if ((uVar2 & 4) != 0) {
          fprintf((FILE *)fp,"M %d greet_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->greet_name);
          uVar2 = pMVar4->progtypes[0];
        }
        if ((uVar2 & 8) != 0) {
          fprintf((FILE *)fp,"M %d give_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->give_name);
          uVar2 = pMVar4->progtypes[0];
        }
        if ((uVar2 & 0x10) != 0) {
          fprintf((FILE *)fp,"M %d fight_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->fight_name);
          uVar2 = pMVar4->progtypes[0];
        }
        if ((uVar2 & 0x20) != 0) {
          fprintf((FILE *)fp,"M %d death_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->death_name);
          uVar2 = pMVar4->progtypes[0];
        }
        if (((uint)uVar2 >> 10 & 1) != 0) {
          fprintf((FILE *)fp,"M %d beat_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->beat_name);
          uVar2 = pMVar4->progtypes[0];
        }
        uVar1 = (uint)uVar2;
        if ((uVar2 & 0x40) != 0) {
          fprintf((FILE *)fp,"M %d pulse_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->pulse_name);
          uVar1 = (uint)pMVar4->progtypes[0];
        }
        if ((char)uVar1 < '\0') {
          fprintf((FILE *)fp,"M %d speech_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->speech_name);
          uVar1 = (uint)pMVar4->progtypes[0];
        }
        if ((uVar1 >> 8 & 1) != 0) {
          fprintf((FILE *)fp,"M %d attack_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->attack_name);
          uVar1 = (uint)pMVar4->progtypes[0];
        }
        if ((uVar1 >> 9 & 1) != 0) {
          fprintf((FILE *)fp,"M %d move_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->move_name);
          uVar1 = (uint)pMVar4->progtypes[0];
        }
        if ((uVar1 >> 0xb & 1) != 0) {
          fprintf((FILE *)fp,"M %d aggress_prog %s\n",(ulong)(uint)(int)pMVar4->vnum,
                  pMVar4->mprogs->aggress_name);
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x400);
  lVar6 = 0;
  do {
    for (pOVar5 = obj_index_hash[lVar6]; pOVar5 != (OBJ_INDEX_DATA *)0x0; pOVar5 = pOVar5->next) {
      if (pOVar5->area == pArea) {
        uVar2 = pOVar5->progtypes[0];
        if ((uVar2 & 1) != 0) {
          fprintf((FILE *)fp,"I %d wear_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->wear_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((uVar2 & 2) != 0) {
          fprintf((FILE *)fp,"I %d remove_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->remove_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((uVar2 & 4) != 0) {
          fprintf((FILE *)fp,"I %d drop_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->drop_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((uVar2 & 8) != 0) {
          fprintf((FILE *)fp,"I %d sac_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->sac_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((uVar2 & 0x10) != 0) {
          fprintf((FILE *)fp,"I %d give_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->give_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((uVar2 & 0x20) != 0) {
          fprintf((FILE *)fp,"I %d greet_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->greet_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((uVar2 & 0x40) != 0) {
          fprintf((FILE *)fp,"I %d fight_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->fight_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if ((char)uVar2 < '\0') {
          fprintf((FILE *)fp,"I %d death_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->death_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if (((uint)uVar2 >> 8 & 1) != 0) {
          fprintf((FILE *)fp,"I %d speech_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->speech_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if (((uint)uVar2 >> 9 & 1) != 0) {
          fprintf((FILE *)fp,"I %d entry_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->entry_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if (((uint)uVar2 >> 10 & 1) != 0) {
          fprintf((FILE *)fp,"I %d get_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->get_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if (((uint)uVar2 >> 0xb & 1) != 0) {
          fprintf((FILE *)fp,"I %d pulse_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->pulse_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if (((uint)uVar2 >> 0xc & 1) != 0) {
          fprintf((FILE *)fp,"I %d invoke_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->invoke_name);
          uVar2 = pOVar5->progtypes[0];
        }
        if (((uint)uVar2 >> 0xd & 1) != 0) {
          fprintf((FILE *)fp,"I %d verb_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->verb_name);
          uVar2 = pOVar5->progtypes[0];
        }
        uVar1 = (uint)uVar2;
        if ((uVar2 & 8) != 0) {
          fprintf((FILE *)fp,"I %d sac_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->sac_name);
          uVar1 = (uint)pOVar5->progtypes[0];
        }
        if ((uVar1 >> 0x11 & 1) != 0) {
          fprintf((FILE *)fp,"I %d look_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->look_name);
          uVar1 = (uint)pOVar5->progtypes[0];
        }
        if ((short)uVar1 < 0) {
          fprintf((FILE *)fp,"I %d open_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->open_name);
          uVar1 = (uint)pOVar5->progtypes[0];
        }
        if ((uVar1 >> 0xe & 1) != 0) {
          fprintf((FILE *)fp,"I %d loot_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->loot_name);
          uVar1 = (uint)pOVar5->progtypes[0];
        }
        if ((uVar1 >> 0x12 & 1) != 0) {
          fprintf((FILE *)fp,"I %d hit_prog %s\n",(ulong)(uint)(int)pOVar5->vnum,
                  pOVar5->iprogs->hit_name);
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x400);
  fwrite("END\n",4,1,(FILE *)fp);
  return;
}

Assistant:

void save_progs(FILE *fp, AREA_DATA *pArea)
{
	long iHash;
	MOB_INDEX_DATA *mIndex = nullptr;
	OBJ_INDEX_DATA *pObjIndex = nullptr;
	ROOM_INDEX_DATA *pRoomIndex = nullptr;

	fprintf(fp, "#IMPROGS\n");

	if (IS_SET(pArea->progtypes, APROG_PULSE))
		fprintf(fp, "A pulse_prog %s\n", pArea->aprogs->pulse_name);

	if (IS_SET(pArea->progtypes, APROG_RESET))
		fprintf(fp, "A reset_prog %s\n", pArea->aprogs->reset_name);

	if (IS_SET(pArea->progtypes, APROG_SUN))
		fprintf(fp, "A sun_prog %s\n", pArea->aprogs->sun_name);

	if (IS_SET(pArea->progtypes, APROG_TICK))
		fprintf(fp, "A tick_prog %s\n", pArea->aprogs->tick_name);

	if (IS_SET(pArea->progtypes, APROG_AGGRESS))
		fprintf(fp, "A aggress_prog %s\n", pArea->aprogs->aggress_name);

	if (IS_SET(pArea->progtypes, APROG_MYELL))
		fprintf(fp, "A myell_prog %s\n", pArea->aprogs->myell_name);

	for (iHash = 0; iHash < MAX_KEY_HASH; iHash++)
	{
		for (pRoomIndex = room_index_hash[iHash]; pRoomIndex; pRoomIndex = pRoomIndex->next)
		{
			if (pRoomIndex->area != pArea)
				continue;

			if (pRoomIndex->progtypes)
			{
				if (IS_SET(pRoomIndex->progtypes, RPROG_PULSE))
					fprintf(fp, "R %d pulse_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->pulse_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_ENTRY))
					fprintf(fp, "R %d entry_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->entry_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_MOVE))
					fprintf(fp, "R %d move_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->move_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_DROP))
					fprintf(fp, "R %d drop_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->drop_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_SPEECH))
					fprintf(fp, "R %d speech_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->speech_name);

				if (IS_SET(pRoomIndex->progtypes, RPROG_OPEN))
					fprintf(fp, "R %d open_prog %s\n", pRoomIndex->vnum, pRoomIndex->rprogs->open_name);
			}
		}

		for (mIndex = mob_index_hash[iHash]; mIndex; mIndex = mIndex->next)
		{
			if (mIndex->area != pArea)
				continue;

			if (!mIndex->progtypes)
				continue;
			if (mIndex->progtypes)
			{
				if (IS_SET(mIndex->progtypes, MPROG_BRIBE))
					fprintf(fp, "M %d bribe_prog %s\n", mIndex->vnum, mIndex->mprogs->bribe_name);

				if (IS_SET(mIndex->progtypes, MPROG_ENTRY))
					fprintf(fp, "M %d entry_prog %s\n", mIndex->vnum, mIndex->mprogs->entry_name);

				if (IS_SET(mIndex->progtypes, MPROG_GREET))
					fprintf(fp, "M %d greet_prog %s\n", mIndex->vnum, mIndex->mprogs->greet_name);

				if (IS_SET(mIndex->progtypes, MPROG_GIVE))
					fprintf(fp, "M %d give_prog %s\n", mIndex->vnum, mIndex->mprogs->give_name);

				if (IS_SET(mIndex->progtypes, MPROG_FIGHT))
					fprintf(fp, "M %d fight_prog %s\n", mIndex->vnum, mIndex->mprogs->fight_name);

				if (IS_SET(mIndex->progtypes, MPROG_DEATH))
					fprintf(fp, "M %d death_prog %s\n", mIndex->vnum, mIndex->mprogs->death_name);

				if (IS_SET(mIndex->progtypes, MPROG_BEAT))
					fprintf(fp, "M %d beat_prog %s\n", mIndex->vnum, mIndex->mprogs->beat_name);

				if (IS_SET(mIndex->progtypes, MPROG_PULSE))
					fprintf(fp, "M %d pulse_prog %s\n", mIndex->vnum, mIndex->mprogs->pulse_name);

				if (IS_SET(mIndex->progtypes, MPROG_SPEECH))
					fprintf(fp, "M %d speech_prog %s\n", mIndex->vnum, mIndex->mprogs->speech_name);

				if (IS_SET(mIndex->progtypes, MPROG_ATTACK))
					fprintf(fp, "M %d attack_prog %s\n", mIndex->vnum, mIndex->mprogs->attack_name);

				if (IS_SET(mIndex->progtypes, MPROG_MOVE))
					fprintf(fp, "M %d move_prog %s\n", mIndex->vnum, mIndex->mprogs->move_name);

				if (IS_SET(mIndex->progtypes, MPROG_AGGRESS))
					fprintf(fp, "M %d aggress_prog %s\n", mIndex->vnum, mIndex->mprogs->aggress_name);
			}
		}
	}

	for (iHash = 0; iHash < MAX_KEY_HASH; iHash++)
	{
		for (pObjIndex = obj_index_hash[iHash]; pObjIndex; pObjIndex = pObjIndex->next)
		{
			if (pObjIndex->area != pArea || !pObjIndex->progtypes)
				continue;

			if (IS_SET(pObjIndex->progtypes, IPROG_WEAR))
				fprintf(fp, "I %d wear_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->wear_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_REMOVE))
				fprintf(fp, "I %d remove_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->remove_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_DROP))
				fprintf(fp, "I %d drop_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->drop_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_SAC))
				fprintf(fp, "I %d sac_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->sac_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_GIVE))
				fprintf(fp, "I %d give_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->give_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_GREET))
				fprintf(fp, "I %d greet_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->greet_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_FIGHT))
				fprintf(fp, "I %d fight_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->fight_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_DEATH))
				fprintf(fp, "I %d death_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->death_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_SPEECH))
				fprintf(fp, "I %d speech_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->speech_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_ENTRY))
				fprintf(fp, "I %d entry_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->entry_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_GET))
				fprintf(fp, "I %d get_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->get_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_PULSE))
				fprintf(fp, "I %d pulse_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->pulse_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_INVOKE))
				fprintf(fp, "I %d invoke_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->invoke_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_VERB))
				fprintf(fp, "I %d verb_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->verb_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_SAC))
				fprintf(fp, "I %d sac_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->sac_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_LOOK))
				fprintf(fp, "I %d look_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->look_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_OPEN))
				fprintf(fp, "I %d open_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->open_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_LOOT))
				fprintf(fp, "I %d loot_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->loot_name);

			if (IS_SET(pObjIndex->progtypes, IPROG_HIT))
				fprintf(fp, "I %d hit_prog %s\n", pObjIndex->vnum, pObjIndex->iprogs->hit_name);
		}
	}

	fprintf(fp, "END\n");
}